

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

vector<Instruction,_std::allocator<Instruction>_> * __thiscall
Client::ReceiveProgramVector
          (vector<Instruction,_std::allocator<Instruction>_> *__return_storage_ptr__,Client *this)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  long lVar2;
  long lVar3;
  undefined8 uStack_38;
  int size;
  
  uStack_38 = in_RAX;
  sVar1 = recv(this->sockfd,(void *)((long)&uStack_38 + 4),4,0);
  this->n = (int)sVar1;
  if ((int)sVar1 < 0) {
    puts("ERROR in Client reading from socket!");
  }
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            (__return_storage_ptr__,(long)uStack_38._4_4_,(allocator_type *)((long)&uStack_38 + 3));
  if (0 < uStack_38._4_4_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      sVar1 = recv(this->sockfd,
                   (void *)((long)((__return_storage_ptr__->
                                   super__Vector_base<Instruction,_std::allocator<Instruction>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->val + lVar2),0x28,0);
      this->n = (int)sVar1;
      if ((int)sVar1 < 0) {
        puts("ERROR in Client reading from socket!");
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (lVar3 < uStack_38._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<Instruction> Client::ReceiveProgramVector()
{
    int size;
    n = recv(sockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR in Client reading from socket!\n");
    std::vector<Instruction> V(size);
    for (int i = 0; i < size; i++)
    {
        n = recv(sockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR in Client reading from socket!\n");
    }
    return V;
}